

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

void __thiscall
OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
OrParamConstraint(OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                  *this,EqualIgnoreCaseConstraint *cons1,EqualIgnoreCaseConstraint *cons2)

{
  ostream *poVar1;
  string *in_RDI;
  stringstream iss;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *in_stack_fffffffffffffda8;
  EqualIgnoreCaseConstraint *in_stack_fffffffffffffdb8;
  EqualIgnoreCaseConstraint *in_stack_fffffffffffffdc0;
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0 [416];
  
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
  ::ParamConstraintFacade
            ((ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
              *)0x20c6bb);
  EqualIgnoreCaseConstraint::EqualIgnoreCaseConstraint
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  EqualIgnoreCaseConstraint::EqualIgnoreCaseConstraint
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = local_1a0;
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>::getConstraintDescription_abi_cxx11_
            (in_stack_fffffffffffffda8);
  poVar1 = std::operator<<(poVar1,local_1d0);
  poVar1 = std::operator<<(poVar1," or ");
  ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>::getConstraintDescription_abi_cxx11_
            (in_stack_fffffffffffffda8);
  poVar1 = std::operator<<(poVar1,local_1f0);
  std::operator<<(poVar1,"");
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=(in_RDI,local_210);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

OrParamConstraint(Cons1T cons1, Cons2T cons2) :
        cons1_(cons1), cons2_(cons2) {
      std::stringstream iss;
      iss << cons1_.getConstraintDescription() << " or "
          << cons2_.getConstraintDescription() << "";
      this->description_ = iss.str();
    }